

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O3

double __thiscall DBaseDecal::GetRealZ(DBaseDecal *this,side_t *wall)

{
  line_t_conflict *plVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  double dVar5;
  
  plVar1 = wall->linedef;
  bVar4 = plVar1->sidedef[0] == wall;
  dVar2 = plVar1->bbox[(ulong)!bVar4 + 4];
  dVar3 = plVar1->bbox[(ulong)bVar4 + 4];
  if (plVar1->bbox[(ulong)bVar4 + 4] == 0.0) {
    dVar3 = dVar2;
  }
  switch(this->RenderFlags >> 8 & 3) {
  case 0:
    return this->Z;
  case 1:
    dVar5 = this->Z;
    if ((plVar1->flags & 8) == 0) {
      return dVar5 + *(double *)((long)dVar3 + 0xa8);
    }
    break;
  case 2:
    dVar5 = this->Z;
    if ((plVar1->flags & 0x10) == 0) {
      return dVar5 + *(double *)((long)dVar3 + 0x50);
    }
    break;
  case 3:
    dVar5 = this->Z;
    if ((plVar1->flags & 0x10) != 0) {
      return dVar5 + *(double *)((long)dVar2 + 0x50);
    }
  }
  return dVar5 + *(double *)((long)dVar2 + 0xa8);
}

Assistant:

double DBaseDecal::GetRealZ (const side_t *wall) const
{
	const line_t *line = wall->linedef;
	const sector_t *front, *back;

	if (line->sidedef[0] == wall)
	{
		front = line->frontsector;
		back = line->backsector;
	}
	else
	{
		front = line->backsector;
		back = line->frontsector;
	}
	if (back == NULL)
	{
		back = front;
	}

	switch (RenderFlags & RF_RELMASK)
	{
	default:
		return Z;
	case RF_RELUPPER:
		if (line->flags & ML_DONTPEGTOP)
		{
			return Z + front->GetPlaneTexZ(sector_t::ceiling);
		}
		else
		{
			return Z + back->GetPlaneTexZ(sector_t::ceiling);
		}
	case RF_RELLOWER:
		if (line->flags & ML_DONTPEGBOTTOM)
		{
			return Z + front->GetPlaneTexZ(sector_t::ceiling);
		}
		else
		{
			return Z + back->GetPlaneTexZ(sector_t::floor);
		}
	case RF_RELMID:
		if (line->flags & ML_DONTPEGBOTTOM)
		{
			return Z + front->GetPlaneTexZ(sector_t::floor);
		}
		else
		{
			return Z + front->GetPlaneTexZ(sector_t::ceiling);
		}
	}
}